

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_dispatch.c
# Opt level: O0

parasail_result_t *
parasail_nw_rowcol_diag_16_dispatcher
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  parasail_result_t *ppVar2;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  int s1Len_local;
  char *s1_local;
  
  iVar1 = parasail_can_use_avx2();
  if (iVar1 == 0) {
    iVar1 = parasail_can_use_sse41();
    if (iVar1 == 0) {
      iVar1 = parasail_can_use_sse2();
      if (iVar1 == 0) {
        parasail_nw_rowcol_diag_16_pointer = parasail_nw;
      }
      else {
        parasail_nw_rowcol_diag_16_pointer = parasail_nw_rowcol_diag_sse2_128_16;
      }
    }
    else {
      parasail_nw_rowcol_diag_16_pointer = parasail_nw_rowcol_diag_sse41_128_16;
    }
  }
  else {
    parasail_nw_rowcol_diag_16_pointer = parasail_nw_rowcol_diag_avx2_256_16;
  }
  ppVar2 = (*parasail_nw_rowcol_diag_16_pointer)(s1,s1Len,s2,s2Len,open,gap,matrix);
  return ppVar2;
}

Assistant:

parasail_result_t* parasail_nw_rowcol_diag_16_dispatcher(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        const parasail_matrix_t *matrix)
{
#if HAVE_AVX2
    if (parasail_can_use_avx2()) {
        parasail_nw_rowcol_diag_16_pointer = parasail_nw_rowcol_diag_avx2_256_16;
    }
    else
#endif
#if HAVE_SSE41
    if (parasail_can_use_sse41()) {
        parasail_nw_rowcol_diag_16_pointer = parasail_nw_rowcol_diag_sse41_128_16;
    }
    else
#endif
#if HAVE_SSE2
    if (parasail_can_use_sse2()) {
        parasail_nw_rowcol_diag_16_pointer = parasail_nw_rowcol_diag_sse2_128_16;
    }
    else
#endif
#if HAVE_ALTIVEC
    if (parasail_can_use_altivec()) {
        parasail_nw_rowcol_diag_16_pointer = parasail_nw_rowcol_diag_altivec_128_16;
    }
    else
#endif
#if HAVE_NEON
    if (parasail_can_use_neon()) {
        parasail_nw_rowcol_diag_16_pointer = parasail_nw_rowcol_diag_neon_128_16;
    }
    else
#endif
    {
        parasail_nw_rowcol_diag_16_pointer = parasail_nw;
    }
    return parasail_nw_rowcol_diag_16_pointer(s1, s1Len, s2, s2Len, open, gap, matrix);
}